

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParametersTest::iterate(GetParametersTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_3a8;
  MessageBuilder local_398;
  GetNameFunc local_218;
  int local_210;
  Enum<int,_2UL> local_208;
  GetNameFunc local_1f8;
  int local_1f0;
  Enum<int,_2UL> local_1e8;
  MessageBuilder local_1d8;
  int local_54;
  GLenum local_50;
  GLenum error;
  GLint parameter_dsa;
  GLint parameter_legacy;
  GLuint j;
  uint local_38;
  undefined4 local_34;
  GLuint i;
  GLuint renderbuffer;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  GetParametersTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  renderbuffer = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)renderbuffer);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  i._3_1_ = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)i._3_1_)) {
    i._2_1_ = 1;
    i._1_1_ = 0;
    for (local_38 = 0; local_34 = 0, local_38 < 4; local_38 = local_38 + 1) {
      (**(code **)(lStack_20 + 0x6e8))(1,&local_34);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glGenRenderbuffers has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22ef);
      (**(code **)(lStack_20 + 0xa0))(0x8d41,local_34);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glBindRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22f2);
      (**(code **)(lStack_20 + 0x1238))(0x8d41,iterate::internalformats[local_38],1,2);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glRenderbufferStorage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x22f5);
      for (parameter_dsa = 0; (uint)parameter_dsa < 4; parameter_dsa = parameter_dsa + 1) {
        error = 0;
        local_50 = 0;
        (**(code **)(lStack_20 + 0xa30))(0x8d41,iterate::pnames[(uint)parameter_dsa],&error);
        dVar2 = (**(code **)(lStack_20 + 0x800))();
        glu::checkError(dVar2,"glGetRenderbufferParameteriv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x230a);
        (**(code **)(lStack_20 + 0x950))(local_34,iterate::pnames[(uint)parameter_dsa],&local_50);
        local_54 = (**(code **)(lStack_20 + 0x800))();
        if (local_54 == 0) {
          if (error != local_50) {
            pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar5 = tcu::TestContext::getLog(pTVar4);
            tcu::TestLog::operator<<(&local_398,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (&local_398,
                                (char (*) [42])"GetNamedRenderbufferParameteriv returned ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_50);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2a6afaf);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&error);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])" was expected for ");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,iterate::pnames_strings + local_38);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [56])
                                       " parameter name of renderbuffer with  internalformat = ");
            EVar7 = glu::getInternalFormatParameterStr(iterate::internalformats[local_38]);
            local_3a8.m_getName = EVar7.m_getName;
            local_3a8.m_value = EVar7.m_value;
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3a8);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [25])", width = 1, height = 2.");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_398);
            i._2_1_ = 0;
          }
        }
        else {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<(&local_1d8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_1d8,
                              (char (*) [56])
                              "GetNamedRenderbufferParameteriv unexpectedly generated ");
          EVar7 = glu::getErrorStr(local_54);
          local_1f8 = EVar7.m_getName;
          local_1f0 = EVar7.m_value;
          local_1e8.m_getName = local_1f8;
          local_1e8.m_value = local_1f0;
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e8);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [25])" error when called with ")
          ;
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,iterate::pnames_strings + local_38);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,(char (*) [56])
                                     " parameter name of renderbuffer with  internalformat = ");
          EVar7 = glu::getInternalFormatParameterStr(iterate::internalformats[local_38]);
          local_218 = EVar7.m_getName;
          local_210 = EVar7.m_value;
          local_208.m_getName = local_218;
          local_208.m_value = local_210;
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_208);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [25])", width = 1, height = 2.")
          ;
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1d8);
          i._2_1_ = 0;
        }
      }
      (**(code **)(lStack_20 + 0x460))(1,&local_34);
      dVar2 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar2,"glDeleteRenderbuffers has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x232a);
    }
    local_34 = 0;
    do {
      iVar1 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar1 != 0);
    if ((i._2_1_ & 1) == 0) {
      if ((i._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetParametersTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test renderbuffer. */
	glw::GLuint renderbuffer = 0;

	/* Test. */
	try
	{
		static const glw::GLenum internalformats[] = { GL_RGBA8, GL_DEPTH_COMPONENT24, GL_STENCIL_INDEX8,
													   GL_DEPTH24_STENCIL8 };

		static const glw::GLuint internalformats_count = sizeof(internalformats) / sizeof(internalformats[0]);

		for (glw::GLuint i = 0; i < internalformats_count; ++i)
		{
			gl.genRenderbuffers(1, &renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

			gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			gl.renderbufferStorage(GL_RENDERBUFFER, internalformats[i], 1, 2);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			static const glw::GLenum pnames[] = { GL_RENDERBUFFER_WIDTH,		   GL_RENDERBUFFER_HEIGHT,
												  GL_RENDERBUFFER_INTERNAL_FORMAT, GL_RENDERBUFFER_SAMPLES,
												  GL_RENDERBUFFER_RED_SIZE,		   GL_RENDERBUFFER_GREEN_SIZE,
												  GL_RENDERBUFFER_BLUE_SIZE,	   GL_RENDERBUFFER_ALPHA_SIZE,
												  GL_RENDERBUFFER_DEPTH_SIZE,	  GL_RENDERBUFFER_STENCIL_SIZE };

			static const glw::GLchar* pnames_strings[] = {
				"GL_RENDERBUFFER_WIDTH",	   "GL_RENDERBUFFER_HEIGHT",	 "GL_RENDERBUFFER_INTERNAL_FORMAT",
				"GL_RENDERBUFFER_SAMPLES",	 "GL_RENDERBUFFER_RED_SIZE",   "GL_RENDERBUFFER_GREEN_SIZE",
				"GL_RENDERBUFFER_BLUE_SIZE",   "GL_RENDERBUFFER_ALPHA_SIZE", "GL_RENDERBUFFER_DEPTH_SIZE",
				"GL_RENDERBUFFER_STENCIL_SIZE"
			};

			for (glw::GLuint j = 0; j < internalformats_count; ++j)
			{
				glw::GLint parameter_legacy = 0;
				glw::GLint parameter_dsa	= 0;

				gl.getRenderbufferParameteriv(GL_RENDERBUFFER, pnames[j], &parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetRenderbufferParameteriv has failed");

				gl.getNamedRenderbufferParameteriv(renderbuffer, pnames[j], &parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedRenderbufferParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << pnames_strings[i]
						<< " parameter name of renderbuffer with  internalformat = "
						<< glu::getInternalFormatParameterStr(internalformats[i]) << ", width = 1, height = 2."
						<< tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (parameter_legacy != parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedRenderbufferParameteriv returned " << parameter_dsa
						<< ", but " << parameter_legacy << " was expected for " << pnames_strings[i]
						<< " parameter name of renderbuffer with  internalformat = "
						<< glu::getInternalFormatParameterStr(internalformats[i]) << ", width = 1, height = 2."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}

			gl.deleteRenderbuffers(1, &renderbuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteRenderbuffers has failed");

			renderbuffer = 0;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (renderbuffer)
	{
		gl.deleteRenderbuffers(1, &renderbuffer);
	}

	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}